

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

print * __thiscall
lest::for_test<lest::print>(lest *this,tests *specification,texts *in,print *perform,int n)

{
  bool bVar1;
  uint uVar2;
  print *perform_00;
  fd_set *__exceptfds;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  test local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_68 [32];
  reference local_48;
  test *testing;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> local_38;
  iterator pos;
  int i;
  int n_local;
  print *perform_local;
  texts *in_local;
  tests *specification_local;
  
  pos._M_current._4_4_ = (int)perform;
  pos._M_current._0_4_ = 0;
  do {
    uVar2 = indefinite(pos._M_current._4_4_);
    __exceptfds = (fd_set *)(ulong)uVar2;
    if (uVar2 == 0 && pos._M_current._4_4_ <= (int)pos._M_current) {
      return (print *)in;
    }
    local_38._M_current =
         (test *)std::vector<lest::test,_std::allocator<lest::test>_>::begin
                           ((vector<lest::test,_std::allocator<lest::test>_> *)this);
    while( true ) {
      testing = (test *)std::vector<lest::test,_std::allocator<lest::test>_>::end
                                  ((vector<lest::test,_std::allocator<lest::test>_> *)this);
      bVar1 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)&testing);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                 ::operator*(&local_38);
      std::__cxx11::string::string(local_68,(string *)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_80,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)specification);
      uVar2 = select((int)local_68,(fd_set *)&local_80,__writefds,__exceptfds,
                     (timeval *)CONCAT44(in_register_00000084,n));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_80);
      std::__cxx11::string::~string(local_68);
      if ((uVar2 & 1) != 0) {
        test::test(&local_b8,local_48);
        perform_00 = print::operator()((print *)in,&local_b8);
        bVar1 = abort<lest::print>(perform_00);
        test::~test(&local_b8);
        if (bVar1) {
          return (print *)in;
        }
      }
      __gnu_cxx::
      __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>::
      operator++(&local_38);
    }
    pos._M_current._0_4_ = (int)pos._M_current + 1;
  } while( true );
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}